

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_slurp_doc_scalar(Parser *this)

{
  code *pcVar1;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr pattern;
  csubstr s_00;
  csubstr s_01;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  long *start;
  long in_RDI;
  csubstr cVar5;
  Parser *in_stack_00000018;
  csubstr in_stack_00000020;
  char msg_2 [47];
  char msg_1 [37];
  size_t skipws;
  char msg [73];
  size_t pos;
  csubstr s;
  Parser *in_stack_00000298;
  Parser *in_stack_00000308;
  Parser *in_stack_00000318;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  Parser *in_stack_fffffffffffffd78;
  Location *in_stack_fffffffffffffd80;
  Location *this_00;
  size_t in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  undefined1 uVar6;
  char *in_stack_fffffffffffffda0;
  basic_substring<const_char> *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  Parser *in_stack_fffffffffffffde0;
  char *local_210;
  size_t local_208;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  Parser *local_1e0;
  undefined1 local_1d8 [16];
  size_t in_stack_fffffffffffffe38;
  Parser *in_stack_fffffffffffffe40;
  basic_substring<char_const> local_170 [24];
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  Parser *in_stack_fffffffffffffec0;
  char local_138 [48];
  basic_substring<char_const> local_108 [16];
  size_t local_f8;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  Parser *local_d0;
  undefined1 local_c8 [88];
  basic_substring<char_const> local_70 [16];
  long local_60;
  basic_substring<const_char> local_58;
  csubstr local_40;
  long local_30;
  long *local_28;
  basic_substring<const_char> *local_20;
  basic_substring<const_char> *local_18;
  long *local_10;
  long *local_8;
  
  local_58.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
  local_58.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
  local_60 = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  basic_substring<char_const>::basic_substring<4ul>(local_70,(char (*) [4])"---");
  pattern.len._0_7_ = in_stack_fffffffffffffdb8;
  pattern.str = (char *)in_stack_fffffffffffffdb0;
  pattern.len._7_1_ = in_stack_fffffffffffffdbf;
  sVar4 = basic_substring<const_char>::find
                    (in_stack_fffffffffffffda8,pattern,(size_t)in_stack_fffffffffffffda0);
  if (sVar4 == 0xffffffffffffffff) {
    memcpy(local_c8,"check failed: (m_state->line_contents.full.find(\"---\") != csubstr::npos)",
           0x49);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    (*pcVar1)(local_c8,0x49,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffd60 = uStack_e8;
    in_stack_fffffffffffffd64 = uStack_e4;
    in_stack_fffffffffffffd68 = local_e0;
    in_stack_fffffffffffffd6c = uStack_dc;
    in_stack_fffffffffffffd70 = uStack_d8;
    in_stack_fffffffffffffd74 = uStack_d4;
    in_stack_fffffffffffffd78 = local_d0;
  }
  if (local_58.len == 0) {
    _line_ended((Parser *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    _scan_line(in_stack_fffffffffffffde0);
    local_58.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_58.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
    local_60 = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  }
  basic_substring<char_const>::basic_substring<3ul>(local_108,(char (*) [3])" \t");
  chars.len = (size_t)in_stack_fffffffffffffda8;
  chars.str = in_stack_fffffffffffffda0;
  local_f8 = basic_substring<const_char>::first_not_of
                       ((basic_substring<const_char> *)
                        CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),chars,
                        in_stack_fffffffffffffd90);
  if (local_f8 != 0xffffffffffffffff) {
    _line_progressed(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_58.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_58.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
    local_60 = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  }
  local_8 = (long *)(in_RDI + 0xa68);
  bVar2 = true;
  if (*(long *)(in_RDI + 0xa70) != 0) {
    bVar2 = *local_8 == 0;
  }
  if (!bVar2) {
    memcpy(local_138,"check failed: (m_val_anchor.empty())",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffda8 = *(basic_substring<const_char> **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffda0 = local_138;
    Location::Location(in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    in_stack_fffffffffffffd78 = in_stack_fffffffffffffec0;
    in_stack_fffffffffffffec0 = in_stack_fffffffffffffd78;
    (*(code *)in_stack_fffffffffffffda8)
              (in_stack_fffffffffffffda0,0x25,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffd60 = uStack_158;
    in_stack_fffffffffffffd64 = uStack_154;
    in_stack_fffffffffffffd68 = local_150;
    in_stack_fffffffffffffd6c = uStack_14c;
    in_stack_fffffffffffffd70 = uStack_148;
    in_stack_fffffffffffffd74 = uStack_144;
  }
  _handle_val_anchors_and_refs(in_stack_fffffffffffffec0);
  start = (long *)(in_RDI + 0xa68);
  uVar6 = true;
  if (*(long *)(in_RDI + 0xa70) != 0) {
    uVar6 = *start == 0;
  }
  local_10 = start;
  if ((bool)uVar6 == false) {
    local_58.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_58.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
    basic_substring<char_const>::basic_substring<3ul>(local_170,(char (*) [3])" \t");
    chars_00.len = (size_t)in_stack_fffffffffffffda8;
    chars_00.str = in_stack_fffffffffffffda0;
    local_f8 = basic_substring<const_char>::first_not_of
                         ((basic_substring<const_char> *)CONCAT17(uVar6,in_stack_fffffffffffffd98),
                          chars_00,(size_t)start);
    if (local_f8 != 0xffffffffffffffff) {
      _line_progressed(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    local_58.str = *(char **)(*(long *)(in_RDI + 0x9f0) + 0x78);
    local_58.len = *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x80);
    local_60 = *(long *)(*(long *)(in_RDI + 0x9f0) + 0x30);
  }
  bVar2 = basic_substring<const_char>::begins_with(&local_58,'\'');
  if (bVar2) {
    cVar5.str._4_4_ = in_stack_fffffffffffffe0c;
    cVar5.str._0_4_ = in_stack_fffffffffffffe08;
    cVar5.len._0_4_ = in_stack_fffffffffffffe10;
    cVar5.len._4_4_ = in_stack_fffffffffffffe14;
    sVar4 = LineContents::current_col
                      ((LineContents *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
                       ,cVar5);
    *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x28) = sVar4;
    local_40 = _scan_squot_scalar(in_stack_00000318);
  }
  else {
    bVar2 = basic_substring<const_char>::begins_with(&local_58,'\"');
    if (bVar2) {
      s_00.str._4_4_ = in_stack_fffffffffffffe0c;
      s_00.str._0_4_ = in_stack_fffffffffffffe08;
      s_00.len._0_4_ = in_stack_fffffffffffffe10;
      s_00.len._4_4_ = in_stack_fffffffffffffe14;
      sVar4 = LineContents::current_col
                        ((LineContents *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),s_00);
      *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x28) = sVar4;
      local_40 = _scan_dquot_scalar(in_stack_00000308);
    }
    else {
      bVar2 = basic_substring<const_char>::begins_with(&local_58,'|');
      if ((bVar2) || (bVar2 = basic_substring<const_char>::begins_with(&local_58,'>'), bVar2)) {
        local_40 = _scan_block(in_stack_00000298);
      }
      else {
        s_01.str._4_4_ = in_stack_fffffffffffffe0c;
        s_01.str._0_4_ = in_stack_fffffffffffffe08;
        s_01.len._0_4_ = in_stack_fffffffffffffe10;
        s_01.len._4_4_ = in_stack_fffffffffffffe14;
        sVar4 = LineContents::current_col
                          ((LineContents *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),s_01);
        *(size_t *)(*(long *)(in_RDI + 0x9f0) + 0x28) = sVar4;
        local_18 = &local_58;
        local_28 = (long *)(in_RDI + 0x18);
        if (local_58.str + local_58.len < (char *)(*local_28 + local_60)) {
          memcpy(local_1d8,"check failed: (s.end() >= m_buf.begin() + pos)",0x2f);
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          pcVar1 = *(code **)(in_RDI + 0x9e8);
          this_00 = (Location *)local_1d8;
          Location::Location(this_00,(char *)in_stack_fffffffffffffd78,
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
          (*pcVar1)(this_00,0x2f,*(undefined8 *)(in_RDI + 0x9d0));
          in_stack_fffffffffffffd78 = local_1e0;
        }
        local_20 = &local_58;
        local_30 = in_RDI + 0x18;
        _line_progressed(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        bVar2 = _at_line_end(in_stack_fffffffffffffd78);
        if (bVar2) {
          cVar5 = _extend_scanned_scalar(in_stack_00000018,in_stack_00000020);
          local_210 = cVar5.str;
          local_58.str = local_210;
          local_208 = cVar5.len;
          local_58.len = local_208;
        }
        local_40.len = local_58.len;
        local_40.str = local_58.str;
      }
    }
  }
  return local_40;
}

Assistant:

csubstr Parser::_slurp_doc_scalar()
{
    csubstr s = m_state->line_contents.rem;
    size_t pos = m_state->pos.offset;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.find("---") != csubstr::npos);
    _c4dbgpf("slurp 0 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(s.len == 0)
    {
        _line_ended();
        _scan_line();
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
    }

    size_t skipws = s.first_not_of(" \t");
    _c4dbgpf("slurp 1 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    if(skipws != npos)
    {
        _line_progressed(skipws);
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 2 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, m_val_anchor.empty());
    _handle_val_anchors_and_refs();
    if(!m_val_anchor.empty())
    {
        s = m_state->line_contents.rem;
        skipws = s.first_not_of(" \t");
        if(skipws != npos)
        {
            _line_progressed(skipws);
        }
        s = m_state->line_contents.rem;
        pos = m_state->pos.offset;
        _c4dbgpf("slurp 3 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));
    }

    if(s.begins_with('\''))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_squot_scalar();
    }
    else if(s.begins_with('"'))
    {
        m_state->scalar_col = m_state->line_contents.current_col(s);
        return _scan_dquot_scalar();
    }
    else if(s.begins_with('|') || s.begins_with('>'))
    {
        return _scan_block();
    }

    _c4dbgpf("slurp 4 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    m_state->scalar_col = m_state->line_contents.current_col(s);
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() + pos);
    _line_progressed(static_cast<size_t>(s.end() - (m_buf.begin() + pos)));

    _c4dbgpf("slurp 5 '{}'. REM='{}'", s, m_buf.sub(m_state->pos.offset));

    if(_at_line_end())
    {
        _c4dbgpf("at line end. curr='{}'", s);
        s = _extend_scanned_scalar(s);
    }

    _c4dbgpf("scalar was '{}'", s);

    return s;
}